

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

ssize_t __thiscall asl::Xdl::read(Xdl *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  Long x;
  longlong lVar3;
  ssize_t sVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  char local_db;
  char local_da;
  char local_d9;
  int n;
  byte bom [3];
  Array<char> buffer;
  int size;
  undefined1 local_b8 [8];
  TextFile tfile;
  XdlParser parser;
  String *file_local;
  
  XdlParser::XdlParser((XdlParser *)&tfile.super_File._endian);
  TextFile::TextFile((TextFile *)local_b8,(String *)CONCAT44(in_register_00000034,__fd),READ);
  bVar1 = File::operator!((File *)local_b8);
  if (bVar1) {
    Var::Var((Var *)this);
  }
  else {
    x = File::size((File *)local_b8);
    lVar3 = clamp<long_long,long_long>(x,0,100000);
    if ((int)lVar3 == 0) {
      Var::Var((Var *)this);
    }
    else {
      iVar2 = min<int>(0x3ffe,(int)lVar3);
      Array<char>::Array((Array<char> *)&n,iVar2 + 1);
      sVar4 = File::read((File *)local_b8,(int)&local_db,(void *)0x3,__nbytes);
      if (((int)sVar4 == 3) && (((local_db != -0x11 || (local_da != -0x45)) || (local_d9 != -0x41)))
         ) {
        File::seek((File *)local_b8,0,START);
      }
      do {
        pcVar5 = Array<char>::data((Array<char> *)&n);
        iVar2 = Array<char>::length((Array<char> *)&n);
        sVar4 = File::read((File *)local_b8,(int)pcVar5,(void *)(ulong)(iVar2 - 1),__nbytes);
        pcVar5 = Array<char>::operator[]((Array<char> *)&n,(int)sVar4);
        *pcVar5 = '\0';
        pcVar5 = Array<char>::data((Array<char> *)&n);
        XdlParser::parse((XdlParser *)&tfile.super_File._endian,pcVar5);
        iVar2 = Array<char>::length((Array<char> *)&n);
        __nbytes = (size_t)(iVar2 - 1U);
      } while ((int)(iVar2 - 1U) <= (int)sVar4);
      XdlParser::parse((XdlParser *)&tfile.super_File._endian," ");
      XdlParser::value((XdlParser *)this);
      Array<char>::~Array((Array<char> *)&n);
    }
  }
  TextFile::~TextFile((TextFile *)local_b8);
  XdlParser::~XdlParser((XdlParser *)&tfile.super_File._endian);
  return (ssize_t)this;
}

Assistant:

Var Xdl::read(const String& file)
{
	XdlParser parser;
	TextFile tfile(file, File::READ);
	if (!tfile)
		return Var();
	int size = int(clamp(tfile.size(), 0ll, 100000ll));
	if (size == 0)
		return Var();
	Array<char> buffer(min(16382, size) + 1);
	byte bom[3];
	if(tfile.read(bom, 3) == 3 && !(bom[0] == 0xef && bom[1] == 0xbb && bom[2] == 0xbf))
		tfile.seek(0);
	while (1)
	{
		int n = tfile.read(buffer.data(), buffer.length() - 1);
		buffer[n] = '\0';
		parser.parse(buffer.data());
		if (n < buffer.length() - 1)
			break;
	}
	parser.parse(" ");
	return parser.value();
}